

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  Mat *unaff_retaddr;
  Mat *in_stack_00000008;
  Convolution *in_stack_00000010;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Option *in_stack_000001b0;
  Mat *in_stack_000001b8;
  Mat *in_stack_000001c0;
  Convolution_x86 *in_stack_000001c8;
  Option *in_stack_00000310;
  Mat *in_stack_00000318;
  Mat *in_stack_00000320;
  Convolution_x86 *in_stack_00000328;
  Option *in_stack_00000c10;
  Mat *in_stack_00000c18;
  Mat *in_stack_00000c20;
  Convolution *in_stack_00000c28;
  Option *in_stack_00000ce0;
  Mat *in_stack_00000ce8;
  Mat *in_stack_00000cf0;
  Mat *in_stack_00000cf8;
  Mat *in_stack_00000d00;
  int in_stack_00001308;
  int in_stack_0000130c;
  Mat *in_stack_00001310;
  Mat *in_stack_00001318;
  Mat *in_stack_00001320;
  Mat *in_stack_00001328;
  int in_stack_000021d0;
  int in_stack_000021d8;
  Option *in_stack_000021e0;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  size_t in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  Mat local_80;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  long local_28;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RSI + 0x28) == 3) {
    if (((*(byte *)(in_RCX + 0x1a) & 1) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x148) != 1)) {
      if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) < 2) &&
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) < 2)) ||
         ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) < 2 &&
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 2)))) {
        if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) < 2) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) < 2)) ||
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) ==
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200))) {
          local_2c = *(int *)(in_RSI + 0x2c);
          local_30 = *(int *)(in_RSI + 0x30);
          local_38 = *(undefined8 *)(in_RSI + 0x10);
          local_3c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) *
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) + -1) + 1;
          local_40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) *
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) + -1) + 1;
          local_28 = in_RCX;
          local_20 = in_RDX;
          Mat::Mat(&local_80);
          Convolution::make_padding
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (Option *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          if (bVar1) {
            iVar2 = -100;
          }
          else {
            local_2c = local_80.w;
            local_30 = local_80.h;
            iVar2 = (local_80.w - local_3c) /
                    *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) + 1;
            iVar3 = (local_80.h - local_40) /
                    *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) + 1;
            Mat::create((Mat *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff56,
                                                       CONCAT24(in_stack_ffffffffffffff54,
                                                                in_stack_ffffffffffffff50))),
                        in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                        (Allocator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
            ;
            if (bVar1) {
              iVar2 = -100;
            }
            else if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) ==
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0)) &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) != 1)) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) ==
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4))) &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1)))) {
              if ((iVar2 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4)) ||
                 (iVar3 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200))) {
                iVar2 = Convolution::forward
                                  (in_stack_00000c28,in_stack_00000c20,in_stack_00000c18,
                                   in_stack_00000c10);
              }
              else {
                iVar2 = forwardDilation_x86(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                                            in_stack_000001b0);
              }
            }
            else {
              if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1)))) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1)) &&
                 ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1 &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1)))) {
                if ((((*(byte *)(in_RDI + 2) & 1) == 0) || (iVar2 < 8)) || (iVar3 < 8)) {
                  conv_im2col_sgemm_sse
                            (in_stack_00001328,in_stack_00001320,in_stack_00001318,in_stack_00001310
                             ,in_stack_0000130c,in_stack_00001308,in_stack_000021d0,
                             in_stack_000021d8,in_stack_000021e0);
                }
                else {
                  conv3x3s1_winograd23_sse
                            (in_stack_00000d00,in_stack_00000cf8,in_stack_00000cf0,in_stack_00000ce8
                             ,in_stack_00000ce0);
                }
                if (in_RDI[1] != 0) {
                  (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
                }
              }
              else {
                conv_im2col_sgemm_sse
                          (in_stack_00001328,in_stack_00001320,in_stack_00001318,in_stack_00001310,
                           in_stack_0000130c,in_stack_00001308,in_stack_000021d0,in_stack_000021d8,
                           in_stack_000021e0);
                if (in_RDI[1] != 0) {
                  (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
                }
              }
              iVar2 = 0;
            }
          }
          Mat::~Mat((Mat *)0x137480);
        }
        else {
          iVar2 = Convolution::forward
                            (in_stack_00000c28,in_stack_00000c20,in_stack_00000c18,in_stack_00000c10
                            );
        }
      }
      else {
        iVar2 = Convolution::forward
                          (in_stack_00000c28,in_stack_00000c20,in_stack_00000c18,in_stack_00000c10);
      }
    }
    else {
      iVar2 = forward_int8_x86(in_stack_00000328,in_stack_00000320,in_stack_00000318,
                               in_stack_00000310);
    }
  }
  else {
    iVar2 = Convolution::forward
                      (in_stack_00000c28,in_stack_00000c20,in_stack_00000c18,in_stack_00000c10);
  }
  return iVar2;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && (stride_w > 1 || stride_h > 1))
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw < dilation_w || outh < dilation_h)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (use_winograd3x3 && outw >= 8 && outh >=8)
        {
            conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//             conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
        }
        else
        {
            conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }
    else
    {
//         conv1x1s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv1x1s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv5x5s1_neon(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}